

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_time.h
# Opt level: O0

uint64_t stm_laptime(uint64_t *last_time)

{
  uint64_t new_ticks;
  uint64_t now;
  uint64_t dt;
  uint64_t *last_time_local;
  
  if (last_time != (uint64_t *)0x0) {
    now = 0;
    new_ticks = stm_now();
    if (*last_time != 0) {
      now = stm_diff(new_ticks,*last_time);
    }
    *last_time = new_ticks;
    return now;
  }
  __assert_fail("last_time",
                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/sokol/sokol_time.h"
                ,0x105,"uint64_t stm_laptime(uint64_t *)");
}

Assistant:

SOKOL_API_IMPL uint64_t stm_laptime(uint64_t* last_time) {
    SOKOL_ASSERT(last_time);
    uint64_t dt = 0;
    uint64_t now = stm_now();
    if (0 != *last_time) {
        dt = stm_diff(now, *last_time);
    }
    *last_time = now;
    return dt;
}